

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O2

int IMU_JY61::uart_open(int fd,char *pathname)

{
  int iVar1;
  int iVar2;
  char *__s;
  
  iVar1 = open(pathname,0x102);
  if (iVar1 == -1) {
    perror("Can\'t Open Serial Port");
  }
  else {
    printf("open %s success!\n",pathname);
    iVar2 = isatty(0);
    if (iVar2 == 0) {
      __s = "standard input is not a terminal device";
    }
    else {
      __s = "isatty success!";
    }
    puts(__s);
  }
  return iVar1;
}

Assistant:

int uart_open(int fd,const char *pathname)
    {
        fd = open(pathname, O_RDWR|O_NOCTTY);
        if (-1 == fd)
        {
            perror("Can't Open Serial Port");
            return(-1);
        }
        else
            printf("open %s success!\n",pathname);
        if(isatty(STDIN_FILENO)==0)
            printf("standard input is not a terminal device\n");
        else
            printf("isatty success!\n");
        return fd;
    }